

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O2

UBool __thiscall
icu_63::CollationIterator::operator==(CollationIterator *this,CollationIterator *other)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar2 = std::type_info::operator==
                    ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                     (type_info *)(other->super_UObject)._vptr_UObject[-1]);
  if (bVar2) {
    uVar1 = (this->ceBuffer).length;
    if (((uVar1 == (other->ceBuffer).length) && (this->cesIndex == other->cesIndex)) &&
       (this->numCpFwd == other->numCpFwd)) {
      uVar4 = 0;
      if (this->isNumeric == other->isNumeric) {
        uVar5 = 0;
        if (0 < (int)uVar1) {
          uVar5 = (ulong)uVar1;
        }
        do {
          uVar3 = uVar4;
          if (uVar5 == uVar3) break;
          uVar4 = uVar3 + 1;
        } while ((this->ceBuffer).buffer.ptr[uVar3] == (other->ceBuffer).buffer.ptr[uVar3]);
        uVar4 = (ulong)((long)(int)uVar1 <= (long)uVar3);
      }
      goto LAB_0022fe0b;
    }
  }
  uVar4 = 0;
LAB_0022fe0b:
  return (UBool)uVar4;
}

Assistant:

UBool
CollationIterator::operator==(const CollationIterator &other) const {
    // Subclasses: Call this method and then add more specific checks.
    // Compare the iterator state but not the collation data (trie & data fields):
    // Assume that the caller compares the data.
    // Ignore skipped since that should be unused between calls to nextCE().
    // (It only stays around to avoid another memory allocation.)
    if(!(typeid(*this) == typeid(other) &&
            ceBuffer.length == other.ceBuffer.length &&
            cesIndex == other.cesIndex &&
            numCpFwd == other.numCpFwd &&
            isNumeric == other.isNumeric)) {
        return FALSE;
    }
    for(int32_t i = 0; i < ceBuffer.length; ++i) {
        if(ceBuffer.get(i) != other.ceBuffer.get(i)) { return FALSE; }
    }
    return TRUE;
}